

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O0

void __thiscall Net::UnZip(Net *this,string *FileName)

{
  int iVar1;
  byte bVar2;
  FUNCTIONS FVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  size_type __n;
  reference this_00;
  value_type_conflict2 local_2f8;
  value_type_conflict2 local_2f0;
  allocator<double> local_2e1;
  value_type_conflict2 local_2e0;
  vector<double,_std::allocator<double>_> local_2d8;
  value_type_conflict2 local_2c0;
  value_type_conflict2 local_2b8;
  int local_2ac;
  undefined1 local_2a8 [4];
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_290;
  int local_274;
  undefined1 local_270 [4];
  int input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  istream local_220 [8];
  ifstream in;
  string *FileName_local;
  Net *this_local;
  
  std::ifstream::ifstream(local_220,(string *)FileName,_S_bin);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                   "File ",FileName);
    std::operator+(&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                   " can\'t be written to\n");
    std::operator<<((ostream *)&std::cerr,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)local_270);
    exit(1);
  }
  FVar3 = net_serializer<int,_void>::deserialize(local_220);
  this->function_type = FVar3;
  local_274 = net_serializer<int,_void>::deserialize(local_220);
  net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
  ::deserialize(&local_290,local_220);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->biases,&local_290);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_290);
  net_serializer<std::vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>,_void>
  ::deserialize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 *)local_2a8,local_220);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::operator=(&this->weights,
              (vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               *)local_2a8);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             *)local_2a8);
  sVar4 = std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::size(&this->weights);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->init,sVar4);
  sVar4 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->biases);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->mesh,sVar4);
  sVar4 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->biases);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->init_biases,sVar4);
  local_2ac = 0;
  while( true ) {
    iVar1 = local_2ac;
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->biases);
    if ((int)sVar4 <= iVar1) break;
    if (local_2ac == 0) {
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->init,0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(pvVar5,0);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->mesh,(long)local_2ac);
      local_2b8 = 0.0;
      std::vector<double,_std::allocator<double>_>::assign(pvVar6,(long)local_274,&local_2b8);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->init_biases,(long)local_2ac);
      sVar4 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&this->biases);
      local_2c0 = 0.0;
      std::vector<double,_std::allocator<double>_>::assign(pvVar6,sVar4,&local_2c0);
    }
    else {
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->init,(long)local_2ac);
      pvVar7 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->weights,(long)local_2ac);
      sVar4 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(pvVar7);
      pvVar7 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->weights,(long)local_2ac);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar7,0);
      __n = std::vector<double,_std::allocator<double>_>::size(pvVar6);
      local_2e0 = 0.0;
      std::allocator<double>::allocator(&local_2e1);
      std::vector<double,_std::allocator<double>_>::vector(&local_2d8,__n,&local_2e0,&local_2e1);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::assign(pvVar5,sVar4,&local_2d8);
      std::vector<double,_std::allocator<double>_>::~vector(&local_2d8);
      std::allocator<double>::~allocator(&local_2e1);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->mesh,(long)local_2ac);
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->biases,(long)local_2ac);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(this_00);
      local_2f0 = 0.0;
      std::vector<double,_std::allocator<double>_>::assign(pvVar6,sVar4,&local_2f0);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->init_biases,(long)local_2ac);
      sVar4 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&this->biases);
      local_2f8 = 0.0;
      std::vector<double,_std::allocator<double>_>::assign(pvVar6,sVar4,&local_2f8);
    }
    local_2ac = local_2ac + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->meshZ,&this->mesh);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void Net::UnZip(const std::string& FileName){
    std::ifstream in(FileName, std::ios::binary);
    if (!in.is_open()){
        std::cerr << "File "+FileName+" can't be written to\n";
        exit(EXIT_FAILURE);
    }
    function_type = (FUNCTIONS)net_serializer<int>::deserialize(in);
    int input = net_serializer<int>::deserialize(in);
    biases = net_serializer<decltype(biases)>::deserialize(in);
    weights = net_serializer<decltype(weights)>::deserialize(in);

    init.resize(weights.size());
    mesh.resize(biases.size());
    init_biases.resize(biases.size());
    for (int i = 0; i < (int)biases.size(); ++i){
        if (i == 0) {
            init[i].resize(0);
            mesh[i].assign(input, 0);
            init_biases[i].assign(biases.size(), 0);
        }else {
            init[i].assign(weights[i].size(), Layer(weights[i][0].size(), 0));
            mesh[i].assign(biases[i].size(), 0);
            init_biases[i].assign(biases.size(), 0);
        }
    }
    meshZ = mesh;
}